

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveUright(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *vec,int *vidx,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *rhs,int *ridx,int rn,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *eps)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  undefined8 uVar3;
  bool bVar4;
  type_conflict5 tVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int *piVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_314;
  ulong local_310;
  cpp_dec_float<50U,_int,_void> local_308;
  cpp_dec_float<50U,_int,_void> local_2c8;
  cpp_dec_float<50U,_int,_void> local_288;
  uint *local_250;
  int *local_248;
  int local_240;
  int local_23c;
  int *local_238;
  int *local_230;
  pointer local_228;
  int *local_220;
  int *local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_210;
  int *local_208;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_200;
  int *local_1f8;
  int *local_1f0;
  cpp_dec_float<50U,_int,_void> local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_2c8.fpclass = cpp_dec_float_finite;
  local_2c8.prec_elem = 10;
  local_2c8.data._M_elems[0] = 0;
  local_2c8.data._M_elems[1] = 0;
  local_2c8.data._M_elems[2] = 0;
  local_2c8.data._M_elems[3] = 0;
  local_2c8.data._M_elems[4] = 0;
  local_2c8.data._M_elems[5] = 0;
  local_2c8.data._M_elems._24_5_ = 0;
  local_2c8.data._M_elems[7]._1_3_ = 0;
  local_2c8.data._M_elems._32_5_ = 0;
  local_2c8.data._M_elems[9]._1_3_ = 0;
  local_2c8.exp = 0;
  local_2c8.neg = false;
  local_288.fpclass = cpp_dec_float_finite;
  local_288.prec_elem = 10;
  local_288.data._M_elems[0] = 0;
  local_288.data._M_elems[1] = 0;
  local_288.data._M_elems[2] = 0;
  local_288.data._M_elems[3] = 0;
  local_288.data._M_elems[4] = 0;
  local_288.data._M_elems[5] = 0;
  local_288.data._M_elems._24_5_ = 0;
  local_288.data._M_elems[7]._1_3_ = 0;
  local_288.data._M_elems._32_5_ = 0;
  local_288.data._M_elems[9]._1_3_ = 0;
  local_288.exp = 0;
  local_288.neg = false;
  local_1f8 = (this->row).orig;
  local_1f0 = (this->row).perm;
  local_218 = (this->col).orig;
  local_220 = (this->u).col.idx;
  local_228 = (this->u).col.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_230 = (this->u).col.len;
  local_238 = (this->u).col.start;
  local_310 = 0;
  local_314 = rn;
  local_250 = (uint *)ridx;
  local_210 = vec;
  local_208 = vidx;
  do {
    do {
      if (local_314 < 1) goto LAB_00224937;
      iVar6 = deQueueMax((int *)local_250,&local_314);
      iVar7 = local_1f8[iVar6];
      local_308.fpclass = cpp_dec_float_finite;
      local_308.prec_elem = 10;
      local_308.data._M_elems[0] = 0;
      local_308.data._M_elems[1] = 0;
      local_308.data._M_elems[2] = 0;
      local_308.data._M_elems[3] = 0;
      local_308.data._M_elems[4] = 0;
      local_308.data._M_elems[5] = 0;
      local_308.data._M_elems._24_5_ = 0;
      local_308.data._M_elems[7]._1_3_ = 0;
      local_308.data._M_elems._32_5_ = 0;
      local_308.data._M_elems[9]._1_3_ = 0;
      local_308.exp = 0;
      local_308.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                (&local_308,
                 &(this->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend,&rhs[iVar7].m_backend);
      local_2c8.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
      local_2c8.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
      local_2c8.data._M_elems[4] = local_308.data._M_elems[4];
      local_2c8.data._M_elems[5] = local_308.data._M_elems[5];
      local_2c8.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
      local_2c8.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
      local_2c8.data._M_elems[0] = local_308.data._M_elems[0];
      local_2c8.data._M_elems[1] = local_308.data._M_elems[1];
      local_2c8.data._M_elems[2] = local_308.data._M_elems[2];
      local_2c8.data._M_elems[3] = local_308.data._M_elems[3];
      local_2c8.exp = local_308.exp;
      local_2c8.neg = local_308.neg;
      local_2c8.fpclass = local_308.fpclass;
      local_2c8.prec_elem = local_308.prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&rhs[iVar7].m_backend,0);
      local_68.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
      local_68.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
      local_68.m_backend.data._M_elems[0] = local_2c8.data._M_elems[0];
      local_68.m_backend.data._M_elems[1] = local_2c8.data._M_elems[1];
      local_68.m_backend.data._M_elems[2] = local_2c8.data._M_elems[2];
      local_68.m_backend.data._M_elems[3] = local_2c8.data._M_elems[3];
      local_68.m_backend.data._M_elems[4] = local_2c8.data._M_elems[4];
      local_68.m_backend.data._M_elems[5] = local_2c8.data._M_elems[5];
      local_68.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
      local_68.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
      local_68.m_backend.exp = local_2c8.exp;
      local_68.m_backend.neg = local_2c8.neg;
      local_68.m_backend.fpclass = local_2c8.fpclass;
      local_68.m_backend.prec_elem = local_2c8.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_a8.m_backend.exp = (eps->m_backend).exp;
      local_a8.m_backend.neg = (eps->m_backend).neg;
      local_a8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_a8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_68,&local_a8);
    } while (!bVar4);
    iVar7 = local_218[iVar6];
    local_208[local_310 & 0xffffffff] = iVar7;
    *(ulong *)(local_210[iVar7].m_backend.data._M_elems + 8) =
         CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_);
    puVar2 = local_210[iVar7].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar2 = local_2c8.data._M_elems._16_8_;
    *(ulong *)(puVar2 + 2) =
         CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_);
    *(undefined8 *)local_210[iVar7].m_backend.data._M_elems = local_2c8.data._M_elems._0_8_;
    *(undefined8 *)(local_210[iVar7].m_backend.data._M_elems + 2) = local_2c8.data._M_elems._8_8_;
    local_210[iVar7].m_backend.exp = local_2c8.exp;
    local_210[iVar7].m_backend.neg = local_2c8.neg;
    local_210[iVar7].m_backend.fpclass = local_2c8.fpclass;
    local_210[iVar7].m_backend.prec_elem = local_2c8.prec_elem;
    pcVar10 = &local_228[local_238[iVar7]].m_backend;
    piVar9 = local_220 + local_238[iVar7];
    iVar7 = local_230[iVar7];
    local_240 = iVar6;
    local_200 = this;
    while( true ) {
      if (iVar7 < 1) break;
      iVar6 = *piVar9;
      pnVar1 = rhs + iVar6;
      uVar3 = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 8);
      local_288.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_288.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_288.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar6].m_backend.data._M_elems;
      local_288.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar6].m_backend.data._M_elems + 2);
      puVar2 = rhs[iVar6].m_backend.data._M_elems + 4;
      local_288.data._M_elems._16_8_ = *(undefined8 *)puVar2;
      uVar3 = *(undefined8 *)(puVar2 + 2);
      local_288.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_288.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_288.exp = rhs[iVar6].m_backend.exp;
      local_288.neg = rhs[iVar6].m_backend.neg;
      local_288.fpclass = rhs[iVar6].m_backend.fpclass;
      local_288.prec_elem = rhs[iVar6].m_backend.prec_elem;
      local_308.data._M_elems._0_8_ = local_308.data._M_elems._0_8_ & 0xffffffff00000000;
      local_248 = piVar9;
      local_23c = iVar7;
      tVar5 = boost::multiprecision::operator==
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_288,(int *)&local_308);
      if (tVar5) {
        local_1e8.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
        local_1e8.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
        local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_2c8.data._M_elems[1];
        uVar3 = local_1e8.data._M_elems._0_8_;
        local_1e8.data._M_elems[2] = local_2c8.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_2c8.data._M_elems[3];
        local_1e8.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
        local_1e8.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
        local_1e8.data._M_elems[4] = local_2c8.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_2c8.data._M_elems[5];
        local_1e8.exp = local_2c8.exp;
        local_1e8.neg = local_2c8.neg;
        local_1e8.fpclass = local_2c8.fpclass;
        local_1e8.prec_elem = local_2c8.prec_elem;
        local_1e8.data._M_elems[0] = local_2c8.data._M_elems[0];
        if (local_2c8.fpclass != cpp_dec_float_finite || local_1e8.data._M_elems[0] != 0) {
          local_1e8.neg = (bool)(local_2c8.neg ^ 1);
        }
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems._24_5_ = 0;
        local_308.data._M_elems[7]._1_3_ = 0;
        local_308.data._M_elems._32_5_ = 0;
        local_308.data._M_elems[9]._1_3_ = 0;
        local_308.exp = 0;
        local_308.neg = false;
        local_1e8.data._M_elems._0_8_ = uVar3;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_308,&local_1e8,pcVar10);
        local_168.m_backend.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
        local_168.m_backend.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
        local_288.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
        local_288.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
        local_168.m_backend.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
        local_168.m_backend.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
        local_288.data._M_elems[4] = local_308.data._M_elems[4];
        local_288.data._M_elems[5] = local_308.data._M_elems[5];
        local_288.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
        local_288.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
        local_288.data._M_elems[0] = local_308.data._M_elems[0];
        local_288.data._M_elems[1] = local_308.data._M_elems[1];
        local_288.data._M_elems[2] = local_308.data._M_elems[2];
        local_288.data._M_elems[3] = local_308.data._M_elems[3];
        local_288.exp = local_308.exp;
        local_288.neg = local_308.neg;
        local_168.m_backend.fpclass = local_308.fpclass;
        local_168.m_backend.prec_elem = local_308.prec_elem;
        local_288.fpclass = local_308.fpclass;
        local_288.prec_elem = local_308.prec_elem;
        local_168.m_backend.data._M_elems[0] = local_308.data._M_elems[0];
        local_168.m_backend.data._M_elems[1] = local_308.data._M_elems[1];
        local_168.m_backend.data._M_elems[2] = local_308.data._M_elems[2];
        local_168.m_backend.data._M_elems[3] = local_308.data._M_elems[3];
        local_168.m_backend.data._M_elems[4] = local_308.data._M_elems[4];
        local_168.m_backend.data._M_elems[5] = local_308.data._M_elems[5];
        local_168.m_backend.exp = local_308.exp;
        local_168.m_backend.neg = local_308.neg;
        local_e8.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 8);
        local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
        local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2)
        ;
        local_e8.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 4);
        local_e8.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((eps->m_backend).data._M_elems + 6);
        local_e8.m_backend.exp = (eps->m_backend).exp;
        local_e8.m_backend.neg = (eps->m_backend).neg;
        local_e8.m_backend.fpclass = (eps->m_backend).fpclass;
        local_e8.m_backend.prec_elem = (eps->m_backend).prec_elem;
        bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          (&local_168,&local_e8);
        if (bVar4) {
          *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
               CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_288.data._M_elems._16_8_;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
               CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
          *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_288.data._M_elems._0_8_;
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_288.data._M_elems._8_8_;
          (pnVar1->m_backend).exp = local_288.exp;
          (pnVar1->m_backend).neg = local_288.neg;
          (pnVar1->m_backend).fpclass = local_288.fpclass;
          (pnVar1->m_backend).prec_elem = local_288.prec_elem;
          enQueueMax((int *)local_250,&local_314,local_1f0[iVar6]);
        }
      }
      else {
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems._24_5_ = 0;
        local_308.data._M_elems[7]._1_3_ = 0;
        local_308.data._M_elems._32_5_ = 0;
        local_308.data._M_elems[9]._1_3_ = 0;
        local_308.exp = 0;
        local_308.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_308,&local_2c8,pcVar10);
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&local_288,&local_308);
        local_1e8.data._M_elems._0_8_ = local_1e8.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar5 = boost::multiprecision::operator==
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_288,(int *)&local_1e8);
        uVar11 = 0xe48e0530;
        uVar12 = 0x2b2bff2e;
        if (!tVar5) {
          uVar11 = 0;
          uVar12 = 0;
        }
        local_308.data._M_elems._0_8_ = CONCAT44(uVar12,uVar11);
        boost::multiprecision::default_ops::
        eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&local_288,(double *)&local_308);
        *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
             CONCAT35(local_288.data._M_elems[9]._1_3_,local_288.data._M_elems._32_5_);
        *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_288.data._M_elems._16_8_;
        *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
             CONCAT35(local_288.data._M_elems[7]._1_3_,local_288.data._M_elems._24_5_);
        *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_288.data._M_elems._0_8_;
        *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_288.data._M_elems._8_8_;
        (pnVar1->m_backend).exp = local_288.exp;
        (pnVar1->m_backend).neg = local_288.neg;
        (pnVar1->m_backend).fpclass = local_288.fpclass;
        (pnVar1->m_backend).prec_elem = local_288.prec_elem;
      }
      piVar9 = local_248 + 1;
      pcVar10 = pcVar10 + 1;
      iVar7 = local_23c + -1;
    }
    local_310 = (ulong)((int)local_310 + 1);
    this = local_200;
  } while ((double)local_314 <= (double)local_240 * 0.2);
  uVar8 = *local_250;
  while (-1 < (int)uVar8) {
    local_248 = (int *)CONCAT44(local_248._4_4_,uVar8);
    iVar7 = local_1f8[uVar8];
    local_308.fpclass = cpp_dec_float_finite;
    local_308.prec_elem = 10;
    local_308.data._M_elems[0] = 0;
    local_308.data._M_elems[1] = 0;
    local_308.data._M_elems[2] = 0;
    local_308.data._M_elems[3] = 0;
    local_308.data._M_elems[4] = 0;
    local_308.data._M_elems[5] = 0;
    local_308.data._M_elems._24_5_ = 0;
    local_308.data._M_elems[7]._1_3_ = 0;
    local_308.data._M_elems._32_5_ = 0;
    local_308.data._M_elems[9]._1_3_ = 0;
    local_308.exp = 0;
    local_308.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_308,
               &(local_200->diag).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar7].m_backend,&rhs[iVar7].m_backend);
    local_2c8.data._M_elems._32_5_ = local_308.data._M_elems._32_5_;
    local_2c8.data._M_elems[9]._1_3_ = local_308.data._M_elems[9]._1_3_;
    local_2c8.data._M_elems[4] = local_308.data._M_elems[4];
    local_2c8.data._M_elems[5] = local_308.data._M_elems[5];
    local_2c8.data._M_elems._24_5_ = local_308.data._M_elems._24_5_;
    local_2c8.data._M_elems[7]._1_3_ = local_308.data._M_elems[7]._1_3_;
    local_2c8.data._M_elems[0] = local_308.data._M_elems[0];
    local_2c8.data._M_elems[1] = local_308.data._M_elems[1];
    local_2c8.data._M_elems[2] = local_308.data._M_elems[2];
    local_2c8.data._M_elems[3] = local_308.data._M_elems[3];
    local_2c8.exp = local_308.exp;
    local_2c8.neg = local_308.neg;
    local_2c8.fpclass = local_308.fpclass;
    local_2c8.prec_elem = local_308.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&rhs[iVar7].m_backend,0);
    local_1a8.m_backend.data._M_elems[7]._1_3_ = local_2c8.data._M_elems[7]._1_3_;
    local_1a8.m_backend.data._M_elems._24_5_ = local_2c8.data._M_elems._24_5_;
    local_1a8.m_backend.data._M_elems[0] = local_2c8.data._M_elems[0];
    local_1a8.m_backend.data._M_elems[1] = local_2c8.data._M_elems[1];
    local_1a8.m_backend.data._M_elems[2] = local_2c8.data._M_elems[2];
    local_1a8.m_backend.data._M_elems[3] = local_2c8.data._M_elems[3];
    local_1a8.m_backend.data._M_elems[4] = local_2c8.data._M_elems[4];
    local_1a8.m_backend.data._M_elems[5] = local_2c8.data._M_elems[5];
    local_1a8.m_backend.data._M_elems[9]._1_3_ = local_2c8.data._M_elems[9]._1_3_;
    local_1a8.m_backend.data._M_elems._32_5_ = local_2c8.data._M_elems._32_5_;
    local_1a8.m_backend.exp = local_2c8.exp;
    local_1a8.m_backend.neg = local_2c8.neg;
    local_1a8.m_backend.fpclass = local_2c8.fpclass;
    local_1a8.m_backend.prec_elem = local_2c8.prec_elem;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    local_128.m_backend.exp = (eps->m_backend).exp;
    local_128.m_backend.neg = (eps->m_backend).neg;
    local_128.m_backend.fpclass = (eps->m_backend).fpclass;
    local_128.m_backend.prec_elem = (eps->m_backend).prec_elem;
    bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_1a8,&local_128);
    if (bVar4) {
      iVar7 = local_218[uVar8];
      local_208[(int)local_310] = iVar7;
      *(ulong *)(local_210[iVar7].m_backend.data._M_elems + 8) =
           CONCAT35(local_2c8.data._M_elems[9]._1_3_,local_2c8.data._M_elems._32_5_);
      puVar2 = local_210[iVar7].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_2c8.data._M_elems._16_8_;
      *(ulong *)(puVar2 + 2) =
           CONCAT35(local_2c8.data._M_elems[7]._1_3_,local_2c8.data._M_elems._24_5_);
      *(undefined8 *)local_210[iVar7].m_backend.data._M_elems = local_2c8.data._M_elems._0_8_;
      *(undefined8 *)(local_210[iVar7].m_backend.data._M_elems + 2) = local_2c8.data._M_elems._8_8_;
      local_210[iVar7].m_backend.exp = local_2c8.exp;
      local_210[iVar7].m_backend.neg = local_2c8.neg;
      local_210[iVar7].m_backend.fpclass = local_2c8.fpclass;
      local_210[iVar7].m_backend.prec_elem = local_2c8.prec_elem;
      piVar9 = local_220 + local_238[iVar7];
      pcVar10 = &local_228[local_238[iVar7]].m_backend;
      for (iVar6 = local_230[iVar7]; 0 < iVar6; iVar6 = iVar6 + -1) {
        local_308.fpclass = cpp_dec_float_finite;
        local_308.prec_elem = 10;
        local_308.data._M_elems[0] = 0;
        local_308.data._M_elems[1] = 0;
        local_308.data._M_elems[2] = 0;
        local_308.data._M_elems[3] = 0;
        local_308.data._M_elems[4] = 0;
        local_308.data._M_elems[5] = 0;
        local_308.data._M_elems._24_5_ = 0;
        local_308.data._M_elems[7]._1_3_ = 0;
        local_308.data._M_elems._32_5_ = 0;
        local_308.data._M_elems[9]._1_3_ = 0;
        local_308.exp = 0;
        local_308.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  (&local_308,&local_2c8,pcVar10);
        iVar7 = *piVar9;
        piVar9 = piVar9 + 1;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                  (&rhs[iVar7].m_backend,&local_308);
        pcVar10 = pcVar10 + 1;
      }
      local_310 = (ulong)((int)local_310 + 1);
    }
    uVar8 = (int)local_248 - 1;
  }
LAB_00224937:
  return (int)local_310;
}

Assistant:

int CLUFactor<R>::vSolveUright(R* vec, int* vidx,
                               R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c, n;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   n = 0;

   while(rn > 0)
   {
      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);
      assert(i >= 0 && i < thedim);
      r = rorig[i];
      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];
      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         assert(c >= 0 && c < thedim);
         vidx[n++] = c;
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            assert(*idx >= 0 && *idx < thedim);
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }

         if(rn > i * verySparseFactor4right)
         {
            /* continue with dense case */
            for(i = *ridx; i >= 0; --i)
            {
               r = rorig[i];
               assert(r >= 0 && r < thedim);
               x = diag[r] * rhs[r];
               rhs[r] = 0;

               if(isNotZero(x, eps))
               {
                  c = corig[i];
                  assert(c >= 0 && c < thedim);
                  vidx[n++] = c;
                  vec[c] = x;
                  val = &cval[cbeg[c]];
                  idx = &cidx[cbeg[c]];
                  j = clen[c];

                  while(j-- > 0)
                  {
                     assert(*idx >= 0 && *idx < thedim);
                     rhs[*idx++] -= x * (*val++);
                  }
               }
            }

            break;
         }
      }
   }

   return n;
}